

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)>
::~FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)>
           *this)

{
  MutexBase *in_RDI;
  MutexLock l;
  UntypedFunctionMockerBase *in_stack_00000240;
  UntypedFunctionMockerBase *in_stack_fffffffffffffff0;
  
  (in_RDI->mutex_).__align = (long)&PTR__FunctionMockerBase_002a0620;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)in_stack_fffffffffffffff0,in_RDI);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked(in_stack_00000240);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (**(code **)((in_RDI->mutex_).__align + 0x10))();
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1894fe);
  MockSpec<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)>
  ::~MockSpec((MockSpec<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)>
               *)0x18950b);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(in_stack_fffffffffffffff0);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }